

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::PlatformSupportsAppleTextStubs(cmMakefile *this)

{
  bool bVar1;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"APPLE",&local_51);
  bVar1 = IsOn(this,&local_30);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"CMAKE_TAPI",&local_52);
    bVar1 = IsSet(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool cmMakefile::PlatformSupportsAppleTextStubs() const
{
  return this->IsOn("APPLE") && this->IsSet("CMAKE_TAPI");
}